

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void tlb_init_mips64(CPUState *cpu)

{
  void *pvVar1;
  int64_t iVar2;
  gpointer pvVar3;
  long lVar4;
  undefined4 *puVar5;
  
  pvVar1 = cpu->env_ptr;
  iVar2 = get_clock_realtime();
  *(undefined2 *)((long)pvVar1 + -0xb50) = 0;
  puVar5 = (undefined4 *)((long)pvVar1 + -0xb30);
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 0x10) {
    *(int64_t *)(puVar5 + 4) = iVar2;
    *(undefined1 (*) [16])(puVar5 + 6) = (undefined1  [16])0x0;
    *(undefined8 *)((long)pvVar1 + lVar4 + -0x50) = 0x3fc0;
    pvVar3 = g_malloc(0x4000);
    *(gpointer *)((long)pvVar1 + lVar4 + -0x48) = pvVar3;
    pvVar3 = g_malloc(0x1000);
    *(gpointer *)(puVar5 + 0xac) = pvVar3;
    *(undefined1 (*) [16])(puVar5 + 8) = (undefined1  [16])0x0;
    *puVar5 = 0xffffffff;
    puVar5[1] = 0xffffffff;
    puVar5[2] = 0xffffffff;
    puVar5[3] = 0xffffffff;
    memset(*(void **)((long)pvVar1 + lVar4 + -0x48),0xff,
           *(long *)((long)pvVar1 + lVar4 + -0x50) + 0x40);
    memset(puVar5 + 0xc,0xff,0x200);
    puVar5 = puVar5 + 0xae;
  }
  return;
}

Assistant:

void tlb_init(CPUState *cpu)
{
    CPUArchState *env = cpu->env_ptr;
    int64_t now = get_clock_realtime();
    int i;

    /* All tlbs are initialized flushed. */
    env_tlb(env)->c.dirty = 0;

    for (i = 0; i < NB_MMU_MODES; i++) {
        tlb_mmu_init(&env_tlb(env)->d[i], &env_tlb(env)->f[i], now);
    }
}